

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equal_range_suite.cpp
# Opt level: O0

void find_real(void)

{
  index_type *this;
  undefined4 local_78c;
  iterator local_788;
  iterator local_770;
  difference_type local_758;
  undefined4 local_74c;
  iterator local_748;
  iterator local_730;
  difference_type local_718 [2];
  iterator local_708;
  iterator local_6f0;
  undefined1 local_6d8 [8];
  pair<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
  result_7;
  iterator local_6a0;
  iterator local_688;
  difference_type local_670;
  undefined4 local_664;
  iterator local_660;
  iterator local_648;
  difference_type local_630 [2];
  iterator local_620;
  iterator local_608;
  undefined1 local_5f0 [8];
  pair<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
  result_6;
  iterator local_5b8;
  iterator local_5a0;
  difference_type local_588;
  undefined4 local_57c;
  iterator local_578;
  iterator local_560;
  difference_type local_548 [2];
  iterator local_538;
  iterator local_520;
  undefined1 local_508 [8];
  pair<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
  result_5;
  iterator local_4d0;
  iterator local_4b8;
  difference_type local_4a0;
  undefined4 local_494;
  iterator local_490;
  iterator local_478;
  difference_type local_460 [2];
  iterator local_450;
  iterator local_438;
  undefined1 local_420 [8];
  pair<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
  result_4;
  iterator local_3e8;
  iterator local_3d0;
  difference_type local_3b8;
  undefined4 local_3ac;
  iterator local_3a8;
  iterator local_390;
  difference_type local_378 [2];
  double local_368;
  iterator local_360;
  iterator local_348;
  undefined1 local_330 [8];
  pair<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
  result_3;
  iterator local_2f8;
  iterator local_2e0;
  difference_type local_2c8;
  undefined4 local_2bc;
  iterator local_2b8;
  iterator local_2a0;
  difference_type local_288;
  int local_27c;
  iterator local_278;
  iterator local_260;
  undefined1 local_248 [8];
  pair<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
  result_2;
  iterator local_210;
  iterator local_1f8;
  difference_type local_1e0;
  undefined4 local_1d4;
  iterator local_1d0;
  iterator local_1b8;
  difference_type local_1a0;
  bool local_191;
  iterator local_190;
  iterator local_178;
  undefined1 local_160 [8];
  pair<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
  result_1;
  iterator local_128;
  iterator local_110;
  difference_type local_f8;
  undefined4 local_ec;
  iterator local_e8;
  iterator local_d0;
  difference_type local_b8;
  nullable local_ac;
  iterator local_a8;
  iterator local_80;
  undefined1 local_68 [8];
  pair<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
  result;
  variable data;
  
  this = &result.second.
          super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
          .current.current;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>
            ((basic_variable<std::allocator<char>_> *)this,3.0);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_80,(basic_variable<std::allocator<char>_> *)this);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_a8,
             (basic_variable<std::allocator<char>_> *)
             &result.second.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  local_ac = null;
  std::
  equal_range<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::nullable>
            ((pair<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
              *)local_68,&local_80,&local_a8,&local_ac);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_80);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_d0,
             (basic_variable<std::allocator<char>_> *)
             &result.second.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_e8,(iterator *)local_68);
  local_b8 = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                       (&local_d0,&local_e8);
  local_ec = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), result.first)","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/equal_range_suite.cpp"
             ,0xa1,"void find_real()",&local_b8,&local_ec);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_d0);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_110,
             (basic_variable<std::allocator<char>_> *)
             &result.second.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_128,
             (iterator *)
             &result.first.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  local_f8 = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                       (&local_110,&local_128);
  result_1.second.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._12_4_ = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), result.second)","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/equal_range_suite.cpp"
             ,0xa2,"void find_real()",&local_f8,
             &result_1.second.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.field_0xc);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_128);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_110);
  std::
  pair<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
  ::~pair((pair<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
           *)local_68);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_178,
             (basic_variable<std::allocator<char>_> *)
             &result.second.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_190,
             (basic_variable<std::allocator<char>_> *)
             &result.second.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  local_191 = true;
  std::equal_range<trial::dynamic::basic_variable<std::allocator<char>>::iterator,bool>
            ((pair<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
              *)local_160,&local_178,&local_190,&local_191);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_190);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_178);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_1b8,
             (basic_variable<std::allocator<char>_> *)
             &result.second.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_1d0,(iterator *)local_160);
  local_1a0 = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                        (&local_1b8,&local_1d0);
  local_1d4 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), result.first)","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/equal_range_suite.cpp"
             ,0xa6,"void find_real()",&local_1a0,&local_1d4);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1d0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_1f8,
             (basic_variable<std::allocator<char>_> *)
             &result.second.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_210,
             (iterator *)
             &result_1.first.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  local_1e0 = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                        (&local_1f8,&local_210);
  result_2.second.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._12_4_ = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), result.second)","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/equal_range_suite.cpp"
             ,0xa7,"void find_real()",&local_1e0,
             &result_2.second.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.field_0xc);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_210);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1f8);
  std::
  pair<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
  ::~pair((pair<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
           *)local_160);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_260,
             (basic_variable<std::allocator<char>_> *)
             &result.second.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_278,
             (basic_variable<std::allocator<char>_> *)
             &result.second.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  local_27c = 2;
  std::equal_range<trial::dynamic::basic_variable<std::allocator<char>>::iterator,int>
            ((pair<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
              *)local_248,&local_260,&local_278,&local_27c);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_278);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_260);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_2a0,
             (basic_variable<std::allocator<char>_> *)
             &result.second.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_2b8,(iterator *)local_248);
  local_288 = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                        (&local_2a0,&local_2b8);
  local_2bc = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), result.first)","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/equal_range_suite.cpp"
             ,0xab,"void find_real()",&local_288,&local_2bc);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_2b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_2a0);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_2e0,
             (basic_variable<std::allocator<char>_> *)
             &result.second.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_2f8,
             (iterator *)
             &result_2.first.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  local_2c8 = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                        (&local_2e0,&local_2f8);
  result_3.second.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._12_4_ = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), result.second)","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/equal_range_suite.cpp"
             ,0xac,"void find_real()",&local_2c8,
             &result_3.second.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.field_0xc);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_2f8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_2e0);
  std::
  pair<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
  ::~pair((pair<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
           *)local_248);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_348,
             (basic_variable<std::allocator<char>_> *)
             &result.second.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_360,
             (basic_variable<std::allocator<char>_> *)
             &result.second.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  local_368 = 3.0;
  std::equal_range<trial::dynamic::basic_variable<std::allocator<char>>::iterator,double>
            ((pair<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
              *)local_330,&local_348,&local_360,&local_368);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_360);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_348);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_390,
             (basic_variable<std::allocator<char>_> *)
             &result.second.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_3a8,(iterator *)local_330);
  local_378[0] = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                           (&local_390,&local_3a8);
  local_3ac = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), result.first)","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/equal_range_suite.cpp"
             ,0xb0,"void find_real()",local_378,&local_3ac);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_3a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_390);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_3d0,
             (basic_variable<std::allocator<char>_> *)
             &result.second.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_3e8,
             (iterator *)
             &result_3.first.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  local_3b8 = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                        (&local_3d0,&local_3e8);
  result_4.second.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._12_4_ = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), result.second)","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/equal_range_suite.cpp"
             ,0xb1,"void find_real()",&local_3b8,
             &result_4.second.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.field_0xc);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_3e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_3d0);
  std::
  pair<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
  ::~pair((pair<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
           *)local_330);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_438,
             (basic_variable<std::allocator<char>_> *)
             &result.second.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_450,
             (basic_variable<std::allocator<char>_> *)
             &result.second.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  std::equal_range<trial::dynamic::basic_variable<std::allocator<char>>::iterator,char[6]>
            ((pair<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
              *)local_420,&local_438,&local_450,(char (*) [6])"alpha");
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_450);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_438);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_478,
             (basic_variable<std::allocator<char>_> *)
             &result.second.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_490,(iterator *)local_420);
  local_460[0] = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                           (&local_478,&local_490);
  local_494 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), result.first)","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/equal_range_suite.cpp"
             ,0xb5,"void find_real()",local_460,&local_494);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_490);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_478);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_4b8,
             (basic_variable<std::allocator<char>_> *)
             &result.second.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_4d0,
             (iterator *)
             &result_4.first.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  local_4a0 = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                        (&local_4b8,&local_4d0);
  result_5.second.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._12_4_ = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), result.second)","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/equal_range_suite.cpp"
             ,0xb6,"void find_real()",&local_4a0,
             &result_5.second.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.field_0xc);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_4d0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_4b8);
  std::
  pair<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
  ::~pair((pair<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
           *)local_420);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_520,
             (basic_variable<std::allocator<char>_> *)
             &result.second.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_538,
             (basic_variable<std::allocator<char>_> *)
             &result.second.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  std::equal_range<trial::dynamic::basic_variable<std::allocator<char>>::iterator,wchar_t[6]>
            ((pair<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
              *)local_508,&local_520,&local_538,(wchar_t (*) [6])L"bravo");
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_538);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_520);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_560,
             (basic_variable<std::allocator<char>_> *)
             &result.second.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_578,(iterator *)local_508);
  local_548[0] = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                           (&local_560,&local_578);
  local_57c = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), result.first)","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/equal_range_suite.cpp"
             ,0xba,"void find_real()",local_548,&local_57c);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_578);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_560);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_5a0,
             (basic_variable<std::allocator<char>_> *)
             &result.second.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_5b8,
             (iterator *)
             &result_5.first.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  local_588 = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                        (&local_5a0,&local_5b8);
  result_6.second.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._12_4_ = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), result.second)","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/equal_range_suite.cpp"
             ,0xbb,"void find_real()",&local_588,
             &result_6.second.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.field_0xc);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_5b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_5a0);
  std::
  pair<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
  ::~pair((pair<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
           *)local_508);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_608,
             (basic_variable<std::allocator<char>_> *)
             &result.second.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_620,
             (basic_variable<std::allocator<char>_> *)
             &result.second.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  std::equal_range<trial::dynamic::basic_variable<std::allocator<char>>::iterator,char16_t[8]>
            ((pair<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
              *)local_5f0,&local_608,&local_620,(char16_t (*) [8])L"charlie");
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_620);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_608);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_648,
             (basic_variable<std::allocator<char>_> *)
             &result.second.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_660,(iterator *)local_5f0);
  local_630[0] = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                           (&local_648,&local_660);
  local_664 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), result.first)","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/equal_range_suite.cpp"
             ,0xbf,"void find_real()",local_630,&local_664);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_660);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_648);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_688,
             (basic_variable<std::allocator<char>_> *)
             &result.second.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_6a0,
             (iterator *)
             &result_6.first.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  local_670 = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                        (&local_688,&local_6a0);
  result_7.second.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._12_4_ = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), result.second)","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/equal_range_suite.cpp"
             ,0xc0,"void find_real()",&local_670,
             &result_7.second.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.field_0xc);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_6a0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_688);
  std::
  pair<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
  ::~pair((pair<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
           *)local_5f0);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_6f0,
             (basic_variable<std::allocator<char>_> *)
             &result.second.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_708,
             (basic_variable<std::allocator<char>_> *)
             &result.second.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  std::equal_range<trial::dynamic::basic_variable<std::allocator<char>>::iterator,char32_t[6]>
            ((pair<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
              *)local_6d8,&local_6f0,&local_708,(char32_t (*) [6])L"delta");
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_708);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_6f0);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_730,
             (basic_variable<std::allocator<char>_> *)
             &result.second.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_748,(iterator *)local_6d8);
  local_718[0] = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                           (&local_730,&local_748);
  local_74c = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), result.first)","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/equal_range_suite.cpp"
             ,0xc4,"void find_real()",local_718,&local_74c);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_748);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_730);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_770,
             (basic_variable<std::allocator<char>_> *)
             &result.second.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_788,
             (iterator *)
             &result_7.first.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  local_758 = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                        (&local_770,&local_788);
  local_78c = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), result.second)","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/equal_range_suite.cpp"
             ,0xc5,"void find_real()",&local_758,&local_78c);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_788);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_770);
  std::
  pair<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
  ::~pair((pair<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>::iterator>
           *)local_6d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)
             &result.second.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  return;
}

Assistant:

void find_real()
{
    variable data(3.0);
    {
        auto result = std::equal_range(data.begin(), data.end(), null);
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), result.first), 0);
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), result.second), 0);
    }
    {
        auto result = std::equal_range(data.begin(), data.end(), true);
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), result.first), 0);
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), result.second), 0);
    }
    {
        auto result = std::equal_range(data.begin(), data.end(), 2);
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), result.first), 0);
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), result.second), 0);
    }
    {
        auto result = std::equal_range(data.begin(), data.end(), 3.0);
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), result.first), 0);
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), result.second), 1);
    }
    {
        auto result = std::equal_range(data.begin(), data.end(), "alpha");
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), result.first), 1);
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), result.second), 1);
    }
    {
        auto result = std::equal_range(data.begin(), data.end(), L"bravo");
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), result.first), 1);
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), result.second), 1);
    }
    {
        auto result = std::equal_range(data.begin(), data.end(), u"charlie");
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), result.first), 1);
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), result.second), 1);
    }
    {
        auto result = std::equal_range(data.begin(), data.end(), U"delta");
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), result.first), 1);
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), result.second), 1);
    }
}